

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O2

void __thiscall OpenMD::Globals::~Globals(Globals *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__Globals_002beb60;
  Utils::
  deletePointers<std::map<std::__cxx11::string,OpenMD::MoleculeStamp*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>>>
            (&this->moleculeStamps_);
  Utils::deletePointers<std::vector<OpenMD::Component*,std::allocator<OpenMD::Component*>>>
            (&this->components_);
  Utils::deletePointers<std::vector<OpenMD::ZConsStamp*,std::allocator<OpenMD::ZConsStamp*>>>
            (&this->zconstraints_);
  Utils::
  deletePointers<std::vector<OpenMD::RestraintStamp*,std::allocator<OpenMD::RestraintStamp*>>>
            (&this->restraints_);
  if (this->flucQpars_ != (FluctuatingChargeParameters *)0x0) {
    (*(this->flucQpars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->rnemdPars_ != (RNEMDParameters *)0x0) {
    (*(this->rnemdPars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->lightPars_ != (LightParameters *)0x0) {
    (*(this->lightPars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->minimizerPars_ != (MinimizerParameters *)0x0) {
    (*(this->minimizerPars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
  ::~_Rb_tree(&(this->fragmentStamps_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
  ::~_Rb_tree(&(this->moleculeStamps_)._M_t);
  std::_Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>::
  ~_Vector_base(&(this->restraints_).
                 super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>
               );
  std::_Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~_Vector_base
            (&(this->zconstraints_).
              super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>);
  std::_Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::~_Vector_base
            (&(this->components_).
              super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->PrivilegedAxis);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->PotentialSelection);
  ParameterBase::~ParameterBase(&(this->ConstraintTime).super_ParameterBase);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter(&this->ElectricField);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter
            (&this->UniformGradientDirection2);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter
            (&this->UniformGradientDirection1);
  ParameterBase::~ParameterBase(&(this->UniformGradientStrength).super_ParameterBase);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter(&this->MagneticField);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter(&this->UniformField);
  ParameterBase::~ParameterBase(&(this->MDfileVersion).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->Alpha).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->HULL_Method);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->Restraint_file);
  ParameterBase::~ParameterBase(&(this->UseRestraints).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MTM_R).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MTM_Sigma).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MTM_Io).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MTM_G).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MTM_Ce).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseMultipleTemperatureMethod).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->NeighborListNeighbors).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->AccumulateBoxQuadrupole).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->AccumulateBoxDipole).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->LangevinBufferRadius).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->FrozenBufferRadius).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->SkipPairLoop).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseSphericalBoundaryConditions).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->BeadSize).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->Viscosity).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->HydroPropFile);
  ParameterBase::~ParameterBase(&(this->StatFilePrecision).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->StatFileFormat);
  ParameterBase::~ParameterBase(&(this->SkinThickness).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->OutputDensity).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->OutputSitePotential).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->OutputFluctuatingCharges).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->OutputElectricField).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->OutputParticlePotential).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->OutputForceVector).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->CompressDumpFile).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->SwitchingFunctionType);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->CutoffMethod);
  ParameterBase::~ParameterBase(&(this->Dielectric).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->DampingAlpha).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseSlabGeometry).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseSurfaceTerm).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->ElectrostaticScreeningMethod);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->ElectrostaticSummationMethod);
  ParameterBase::~ParameterBase(&(this->PrintTaggedPairDistance).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->TaggedAtomPair).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->PrintHeatFlux).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->PrintVirialTensor).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->PrintPressureTensor).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->SurfaceTension).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->ForceFieldFileName);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->ForceFieldVariant);
  ParameterBase::~ParameterBase(&(this->ThermodynamicIntegrationK).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ThermodynamicIntegrationLambda).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseThermodynamicIntegration).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ZconsUsingSMD).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ZconsFixtime).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ZconsGap).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->OrthoBoxTolerance).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseIntialExtendedSystemState).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseInitalTime).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->Seed).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->ZconsForcePolicy);
  ParameterBase::~ParameterBase(&(this->ZconsTol).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ZconsTime).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->LangevinPistonDrag).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->TauBarostat).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->TauThermostat).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseLongRangeCorrections).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UseAtomicVirial).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->TargetPressure).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ConserveAngularMomentum).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ConserveLinearMomentum).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->UsePeriodicBoundaryConditions).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ThermalTime).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->TempSet).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->SwitchingRadius).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->CutoffRadius).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->StatusTime).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ResetTime).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->SampleTime).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->FinalConfig);
  ParameterBase::~ParameterBase(&(this->RunTime).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->Dt).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->Ensemble);
  ParameterBase::~ParameterBase(&(this->TargetTemp).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->ForceField);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

Globals::~Globals() {
    Utils::deletePointers(moleculeStamps_);

    Utils::deletePointers(components_);
    Utils::deletePointers(zconstraints_);
    Utils::deletePointers(restraints_);

    delete flucQpars_;
    delete rnemdPars_;
    delete lightPars_;
    delete minimizerPars_;
  }